

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dosbox_opl3.cpp
# Opt level: O2

void __thiscall DosBoxOPL3::setRate(DosBoxOPL3 *this,uint32_t rate)

{
  Chip *this_00;
  uint uVar1;
  
  OPLChipBaseT<DosBoxOPL3>::setRate((OPLChipBaseT<DosBoxOPL3> *)this,rate);
  this_00 = (Chip *)this->m_chip;
  DBOPL::Chip::Chip(this_00);
  uVar1 = (*(this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.
            super_OPLChipBase._vptr_OPLChipBase[6])(this);
  DBOPL::Handler::Init((Handler *)this_00,(ulong)uVar1);
  return;
}

Assistant:

void DosBoxOPL3::setRate(uint32_t rate)
{
    OPLChipBaseBufferedT::setRate(rate);
    DBOPL::Handler *chip_r = reinterpret_cast<DBOPL::Handler*>(m_chip);
    chip_r->~Handler();
    new(chip_r) DBOPL::Handler;
    chip_r->Init(effectiveRate());
}